

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *source,
               ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  
  if (((source->super_ArgMinMaxStateBase).is_initialized == true) &&
     (((target->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar1 = GreaterThan::Operation<duckdb::hugeint_t>(&target->value,&source->value), bVar1)))) {
    Assign<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>>
              (target,&source->arg,&source->value,(source->super_ArgMinMaxStateBase).arg_null);
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}